

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools.cpp
# Opt level: O3

AbstractTool * CreateTool(string *arg)

{
  size_t __n;
  __type _Var1;
  int iVar2;
  SplitTool *this;
  ConvertTool *this_00;
  CountTool *this_01;
  CoverageTool *this_02;
  FilterTool *this_03;
  HeaderTool *this_04;
  
  __n = arg->_M_string_length;
  if ((__n == CONVERT_abi_cxx11_._M_string_length) &&
     ((__n == 0 ||
      (iVar2 = bcmp((arg->_M_dataplus)._M_p,CONVERT_abi_cxx11_._M_dataplus._M_p,__n), iVar2 == 0))))
  {
    this_00 = (ConvertTool *)operator_new(0x18);
    BamTools::ConvertTool::ConvertTool(this_00);
    return &this_00->super_AbstractTool;
  }
  if ((__n == COUNT_abi_cxx11_._M_string_length) &&
     ((__n == 0 ||
      (iVar2 = bcmp((arg->_M_dataplus)._M_p,COUNT_abi_cxx11_._M_dataplus._M_p,__n), iVar2 == 0)))) {
    this_01 = (CountTool *)operator_new(0x18);
    BamTools::CountTool::CountTool(this_01);
    return &this_01->super_AbstractTool;
  }
  if ((__n == COVERAGE_abi_cxx11_._M_string_length) &&
     ((__n == 0 ||
      (iVar2 = bcmp((arg->_M_dataplus)._M_p,COVERAGE_abi_cxx11_._M_dataplus._M_p,__n), iVar2 == 0)))
     ) {
    this_02 = (CoverageTool *)operator_new(0x18);
    BamTools::CoverageTool::CoverageTool(this_02);
    return &this_02->super_AbstractTool;
  }
  if ((__n == FILTER_abi_cxx11_._M_string_length) &&
     ((__n == 0 ||
      (iVar2 = bcmp((arg->_M_dataplus)._M_p,FILTER_abi_cxx11_._M_dataplus._M_p,__n), iVar2 == 0))))
  {
    this_03 = (FilterTool *)operator_new(0x18);
    BamTools::FilterTool::FilterTool(this_03);
    return &this_03->super_AbstractTool;
  }
  if ((__n == HEADER_abi_cxx11_._M_string_length) &&
     ((__n == 0 ||
      (iVar2 = bcmp((arg->_M_dataplus)._M_p,HEADER_abi_cxx11_._M_dataplus._M_p,__n), iVar2 == 0))))
  {
    this_04 = (HeaderTool *)operator_new(0x18);
    BamTools::HeaderTool::HeaderTool(this_04);
    return &this_04->super_AbstractTool;
  }
  if ((__n == INDEX_abi_cxx11_._M_string_length) &&
     ((__n == 0 ||
      (iVar2 = bcmp((arg->_M_dataplus)._M_p,INDEX_abi_cxx11_._M_dataplus._M_p,__n), iVar2 == 0)))) {
    this = (SplitTool *)operator_new(0x18);
    BamTools::IndexTool::IndexTool((IndexTool *)this);
  }
  else {
    _Var1 = std::operator==(arg,&MERGE_abi_cxx11_);
    if (_Var1) {
      this = (SplitTool *)operator_new(0x18);
      BamTools::MergeTool::MergeTool((MergeTool *)this);
    }
    else {
      _Var1 = std::operator==(arg,&RANDOM_abi_cxx11_);
      if (_Var1) {
        this = (SplitTool *)operator_new(0x18);
        BamTools::RandomTool::RandomTool((RandomTool *)this);
      }
      else {
        _Var1 = std::operator==(arg,&RESOLVE_abi_cxx11_);
        if (_Var1) {
          this = (SplitTool *)operator_new(0x18);
          BamTools::ResolveTool::ResolveTool((ResolveTool *)this);
        }
        else {
          _Var1 = std::operator==(arg,&REVERT_abi_cxx11_);
          if (_Var1) {
            this = (SplitTool *)operator_new(0x18);
            BamTools::RevertTool::RevertTool((RevertTool *)this);
          }
          else {
            _Var1 = std::operator==(arg,&SORT_abi_cxx11_);
            if (_Var1) {
              this = (SplitTool *)operator_new(0x18);
              BamTools::SortTool::SortTool((SortTool *)this);
            }
            else {
              _Var1 = std::operator==(arg,&SPLIT_abi_cxx11_);
              if (_Var1) {
                this = (SplitTool *)operator_new(0x18);
                BamTools::SplitTool::SplitTool(this);
              }
              else {
                _Var1 = std::operator==(arg,&STATS_abi_cxx11_);
                if (_Var1) {
                  this = (SplitTool *)operator_new(0x18);
                  BamTools::StatsTool::StatsTool((StatsTool *)this);
                }
                else {
                  this = (SplitTool *)0x0;
                }
              }
            }
          }
        }
      }
    }
  }
  return &this->super_AbstractTool;
}

Assistant:

AbstractTool* CreateTool(const std::string& arg)
{

    // determine tool type based on arg
    if (arg == CONVERT) {
        return new ConvertTool;
    }
    if (arg == COUNT) {
        return new CountTool;
    }
    if (arg == COVERAGE) {
        return new CoverageTool;
    }
    if (arg == FILTER) {
        return new FilterTool;
    }
    if (arg == HEADER) {
        return new HeaderTool;
    }
    if (arg == INDEX) {
        return new IndexTool;
    }
    if (arg == MERGE) {
        return new MergeTool;
    }
    if (arg == RANDOM) {
        return new RandomTool;
    }
    if (arg == RESOLVE) {
        return new ResolveTool;
    }
    if (arg == REVERT) {
        return new RevertTool;
    }
    if (arg == SORT) {
        return new SortTool;
    }
    if (arg == SPLIT) {
        return new SplitTool;
    }
    if (arg == STATS) {
        return new StatsTool;
    }

    // unknown arg
    return 0;
}